

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  result_type rVar1;
  result_type_conflict rVar2;
  string *in_RDI;
  int local_2734;
  allocator local_272e;
  undefined1 local_272d;
  int i;
  undefined1 local_2720 [8];
  mt19937 engine;
  random_device seed_gen;
  string *result;
  
  std::random_device::random_device((random_device *)&engine._M_p);
  rVar1 = std::random_device::operator()((random_device *)&engine._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  local_272d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"--cpp-httplib-multipart-data-",&local_272e);
  std::allocator<char>::~allocator((allocator<char> *)&local_272e);
  for (local_2734 = 0; local_2734 < 0x10; local_2734 = local_2734 + 1) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2720);
    std::__cxx11::string::operator+=
              ((string *)in_RDI,
               "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar2 % 0x3e]);
  }
  local_272d = 1;
  std::random_device::~random_device((random_device *)&engine._M_p);
  return in_RDI;
}

Assistant:

inline std::string make_multipart_data_boundary() {
  static const char data[] =
      "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  std::string result = "--cpp-httplib-multipart-data-";

  for (auto i = 0; i < 16; i++) {
    result += data[engine() % (sizeof(data) - 1)];
  }

  return result;
}